

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O1

void __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::remove_timer(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
               *this,per_timer_data *timer)

{
  pointer *pphVar1;
  pointer phVar2;
  pointer phVar3;
  ulong index;
  per_timer_data *ppVar4;
  duration dVar5;
  per_timer_data *ppVar6;
  ulong uVar7;
  heap_entry tmp;
  
  phVar2 = (this->heap_).
           super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  phVar3 = (this->heap_).
           super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (phVar2 != phVar3) {
    index = timer->heap_index_;
    uVar7 = (long)phVar3 - (long)phVar2 >> 4;
    if (index < uVar7) {
      uVar7 = uVar7 - 1;
      if (index == uVar7) {
        timer->heap_index_ = 0xffffffffffffffff;
        (this->heap_).
        super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
        ._M_impl.super__Vector_impl_data._M_finish = phVar3 + -1;
      }
      else {
        dVar5.__r = phVar2[index].time_.__d.__r;
        ppVar4 = phVar2[index].timer_;
        ppVar6 = phVar2[uVar7].timer_;
        phVar2[index].time_.__d.__r = phVar2[uVar7].time_.__d.__r;
        phVar2[index].timer_ = ppVar6;
        phVar2 = (this->heap_).
                 super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar7;
        (phVar2->time_).__d.__r = dVar5.__r;
        phVar2->timer_ = ppVar4;
        phVar2 = (this->heap_).
                 super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        (phVar2[index].timer_)->heap_index_ = index;
        (phVar2[uVar7].timer_)->heap_index_ = uVar7;
        timer->heap_index_ = 0xffffffffffffffff;
        pphVar1 = &(this->heap_).
                   super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pphVar1 = *pphVar1 + -1;
        if ((index == 0) ||
           (*(long *)((long)&(phVar2->time_).__d.__r + (index * 8 - 8 & 0xfffffffffffffff0)) <=
            phVar2[index].time_.__d.__r)) {
          down_heap(this,index);
        }
        else {
          up_heap(this,index);
        }
      }
    }
  }
  if (this->timers_ == timer) {
    this->timers_ = timer->next_;
  }
  ppVar4 = timer->prev_;
  if (ppVar4 != (per_timer_data *)0x0) {
    ppVar4->next_ = timer->next_;
  }
  if (timer->next_ != (per_timer_data *)0x0) {
    timer->next_->prev_ = ppVar4;
  }
  timer->next_ = (per_timer_data *)0x0;
  timer->prev_ = (per_timer_data *)0x0;
  return;
}

Assistant:

void remove_timer(per_timer_data& timer)
  {
    // Remove the timer from the heap.
    std::size_t index = timer.heap_index_;
    if (!heap_.empty() && index < heap_.size())
    {
      if (index == heap_.size() - 1)
      {
        timer.heap_index_ = (std::numeric_limits<std::size_t>::max)();
        heap_.pop_back();
      }
      else
      {
        swap_heap(index, heap_.size() - 1);
        timer.heap_index_ = (std::numeric_limits<std::size_t>::max)();
        heap_.pop_back();
        if (index > 0 && Time_Traits::less_than(
              heap_[index].time_, heap_[(index - 1) / 2].time_))
          up_heap(index);
        else
          down_heap(index);
      }
    }

    // Remove the timer from the linked list of active timers.
    if (timers_ == &timer)
      timers_ = timer.next_;
    if (timer.prev_)
      timer.prev_->next_ = timer.next_;
    if (timer.next_)
      timer.next_->prev_= timer.prev_;
    timer.next_ = 0;
    timer.prev_ = 0;
  }